

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O0

void __thiscall
Lib::
DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
::fixDecrease1(DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
               *this,size_t idx)

{
  bool bVar1;
  DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
  *idxA;
  DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
  *in_RSI;
  size_t in_RDI;
  size_t parent;
  
  while( true ) {
    if (in_RSI < (DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
                  *)0x2) {
      return;
    }
    idxA = (DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
            *)((ulong)in_RSI >> 1);
    bVar1 = isGreater1(in_RSI,(size_t)idxA,in_RDI);
    if (!bVar1) break;
    swapInHeap1(in_RSI,(size_t)idxA,in_RDI);
    in_RSI = idxA;
  }
  return;
}

Assistant:

void fixDecrease1(size_t idx)
  {
    ASS_G(idx, 0);
    ASS_LE(idx, size());

    while(idx>1) {
      size_t parent = idx/2;
      if(!isGreater1(parent, idx)) {
	break;
      }
      swapInHeap1(idx, parent);
      idx = parent;
    }
  }